

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O0

uint SoapySDRDevice_readGPIO(SoapySDRDevice *device,char *bank)

{
  char *in_RSI;
  long *in_RDI;
  exception *ex;
  allocator local_39;
  string local_38 [32];
  char *local_18;
  long *local_10;
  uint local_4;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  SoapySDRDevice_clearError();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,local_18,&local_39);
  local_4 = (**(code **)(*local_10 + 0x378))(local_10,local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return local_4;
}

Assistant:

__SOAPY_SDR_C_CATCH
}

unsigned SoapySDRDevice_readGPIO(const SoapySDRDevice *device, const char *bank)
{
    __SOAPY_SDR_C_TRY
    return device->readGPIO(bank);
    __SOAPY_SDR_C_CATCH
}